

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

BoundsCheck *
wasm::makeArrayBoundsCheck
          (BoundsCheck *__return_storage_ptr__,Expression *ref,Expression *index,Function *func,
          Builder *builder,Expression *length)

{
  uintptr_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  Index IVar6;
  Index IVar7;
  Index IVar8;
  Type TVar9;
  Type TVar10;
  undefined1 *puVar11;
  Type TVar12;
  Expression *pEVar13;
  Type local_50;
  Type refType;
  Expression *local_38;
  
  local_50.id = (ref->type).id;
  TVar12.id = (uintptr_t)builder;
  bVar5 = Type::isExact(&local_50);
  if (bVar5) {
    local_50 = Type::with(&local_50,Inexact);
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_50.id;
  IVar6 = Builder::addVar((Builder *)func,(Function *)0x0,(Name)(auVar2 << 0x40),TVar12);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (index->type).id;
  IVar7 = Builder::addVar((Builder *)func,(Function *)0x0,(Name)(auVar3 << 0x40),TVar12);
  refType.id = local_50.id;
  TVar9.id = (uintptr_t)MixedArena::allocSpace(&builder->wasm->allocator,0x20,8);
  *(undefined1 *)TVar9.id = 9;
  *(undefined8 *)(TVar9.id + 8) = 0;
  *(Index *)(TVar9.id + 0x10) = IVar6;
  *(Expression **)(TVar9.id + 0x18) = ref;
  wasm::LocalSet::makeTee(TVar9);
  TVar10.id = (uintptr_t)MixedArena::allocSpace(&builder->wasm->allocator,0x20,8);
  *(undefined1 *)TVar10.id = 9;
  *(undefined8 *)(TVar10.id + 8) = 0;
  *(Index *)(TVar10.id + 0x10) = IVar7;
  *(Expression **)(TVar10.id + 0x18) = index;
  wasm::LocalSet::makeTee(TVar10);
  puVar11 = (undefined1 *)MixedArena::allocSpace(&builder->wasm->allocator,0x18,8);
  *puVar11 = 0x4c;
  local_38 = (Expression *)0x0;
  *(undefined8 *)(puVar11 + 8) = 0;
  *(uintptr_t *)(puVar11 + 0x10) = TVar9.id;
  wasm::ArrayLen::finalize();
  TVar9.id = TVar10.id;
  if (length != (Expression *)0x0) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (length->type).id;
    IVar8 = Builder::addVar((Builder *)func,(Function *)0x0,(Name)(auVar4 << 0x40),TVar12);
    TVar12.id = (uintptr_t)MixedArena::allocSpace(&builder->wasm->allocator,0x20,8);
    *(undefined1 *)TVar12.id = 9;
    *(undefined8 *)(TVar12.id + 8) = 0;
    *(Index *)(TVar12.id + 0x10) = IVar8;
    *(Expression **)(TVar12.id + 0x18) = length;
    refType.id = (uintptr_t)builder;
    wasm::LocalSet::makeTee(TVar12);
    TVar9.id = (uintptr_t)MixedArena::allocSpace((MixedArena *)(*(long *)refType.id + 0x200),0x28,8)
    ;
    builder = (Builder *)refType;
    *(undefined1 *)TVar9.id = 0x10;
    *(undefined8 *)(TVar9.id + 8) = 0;
    *(undefined4 *)(TVar9.id + 0x10) = 0;
    *(uintptr_t *)(TVar9.id + 0x18) = TVar10.id;
    *(uintptr_t *)(TVar9.id + 0x20) = TVar12.id;
    wasm::Binary::finalize();
    uVar1 = (length->type).id;
    local_38 = (Expression *)MixedArena::allocSpace((MixedArena *)(*(long *)builder + 0x200),0x18,8)
    ;
    local_38->_id = LocalGetId;
    *(Index *)(local_38 + 1) = IVar8;
    (local_38->type).id = uVar1;
  }
  pEVar13 = (Expression *)MixedArena::allocSpace(&builder->wasm->allocator,0x28,8);
  pEVar13->_id = BinaryId;
  (pEVar13->type).id = 0;
  *(undefined4 *)(pEVar13 + 1) = 0x12;
  pEVar13[1].type.id = TVar9.id;
  *(undefined1 **)(pEVar13 + 2) = puVar11;
  wasm::Binary::finalize();
  TVar12.id = local_50.id;
  __return_storage_ptr__->condition = pEVar13;
  pEVar13 = (Expression *)MixedArena::allocSpace(&builder->wasm->allocator,0x18,8);
  pEVar13->_id = LocalGetId;
  *(Index *)(pEVar13 + 1) = IVar6;
  (pEVar13->type).id = TVar12.id;
  __return_storage_ptr__->getRef = pEVar13;
  uVar1 = (index->type).id;
  pEVar13 = (Expression *)MixedArena::allocSpace(&builder->wasm->allocator,0x18,8);
  pEVar13->_id = LocalGetId;
  *(Index *)(pEVar13 + 1) = IVar7;
  (pEVar13->type).id = uVar1;
  __return_storage_ptr__->getIndex = pEVar13;
  __return_storage_ptr__->getLength = local_38;
  return __return_storage_ptr__;
}

Assistant:

static auto makeArrayBoundsCheck(Expression* ref,
                                 Expression* index,
                                 Function* func,
                                 Builder& builder,
                                 Expression* length = nullptr) {
  // The reference might be a RefNull, in which case its type is exact. But we
  // want to avoid creating exact-typed locals until we support them more widely
  // in the fuzzer, so adjust the type. TODO: remove this once exact references
  // are better supported.
  Type refType = ref->type;
  if (refType.isExact()) {
    refType = refType.with(Inexact);
  }
  auto tempRef = builder.addVar(func, refType);
  auto tempIndex = builder.addVar(func, index->type);
  auto* teeRef = builder.makeLocalTee(tempRef, ref, refType);
  auto* teeIndex = builder.makeLocalTee(tempIndex, index, index->type);
  auto* getSize = builder.makeArrayLen(teeRef);

  Expression* effectiveIndex = teeIndex;

  Expression* getLength = nullptr;
  if (length) {
    // Store the length so we can reuse it.
    auto tempLength = builder.addVar(func, length->type);
    auto* teeLength = builder.makeLocalTee(tempLength, length, length->type);
    // The effective index will now include the length.
    effectiveIndex = builder.makeBinary(AddInt32, effectiveIndex, teeLength);
    getLength = builder.makeLocalGet(tempLength, length->type);
  }

  struct BoundsCheck {
    // A condition that checks if the index is in bounds.
    Expression* condition;
    // An additional use of the reference (we stored the reference in a local,
    // so this reads from that local).
    Expression* getRef;
    // An additional use of the index (as with the ref, it reads from a local).
    Expression* getIndex;
    // An additional use of the length, if it was provided.
    Expression* getLength = nullptr;
  } result = {builder.makeBinary(LtUInt32, effectiveIndex, getSize),
              builder.makeLocalGet(tempRef, refType),
              builder.makeLocalGet(tempIndex, index->type),
              getLength};
  return result;
}